

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Vec_Int_t * Gia_ManSortCoBySuppSize(Gia_Man_t *p,Vec_Wec_t *vSupps)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Int_t *p_02;
  word *pData;
  word wVar2;
  undefined4 local_3c;
  int i;
  word Entry;
  Vec_Int_t *vSuppOne;
  Vec_Wrd_t *vSortData;
  Vec_Int_t *vOrder;
  Vec_Wec_t *vSupps_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCoNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManCoNum(p);
  p_01 = Vec_WrdAlloc(iVar1);
  for (local_3c = 0; iVar1 = Vec_WecSize(vSupps), local_3c < iVar1; local_3c = local_3c + 1) {
    p_02 = Vec_WecEntry(vSupps,local_3c);
    iVar1 = Vec_IntSize(p_02);
    Vec_WrdPush(p_01,(long)local_3c << 0x20 | (long)iVar1);
  }
  pData = Vec_WrdArray(p_01);
  iVar1 = Vec_WrdSize(p_01);
  Abc_QuickSort3(pData,iVar1,1);
  for (local_3c = 0; iVar1 = Vec_WrdSize(p_01), local_3c < iVar1; local_3c = local_3c + 1) {
    wVar2 = Vec_WrdEntry(p_01,local_3c);
    Vec_IntPush(p_00,(int)(wVar2 >> 0x20));
  }
  Vec_WrdFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManSortCoBySuppSize( Gia_Man_t * p, Vec_Wec_t * vSupps )
{
    Vec_Int_t * vOrder = Vec_IntAlloc( Gia_ManCoNum(p) );
    Vec_Wrd_t * vSortData = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Vec_Int_t * vSuppOne; word Entry; int i;
    Vec_WecForEachLevel( vSupps, vSuppOne, i )
        Vec_WrdPush( vSortData, ((word)i << 32) | Vec_IntSize(vSuppOne) );
    Abc_QuickSort3( Vec_WrdArray(vSortData), Vec_WrdSize(vSortData), 1 );
    Vec_WrdForEachEntry( vSortData, Entry, i )
        Vec_IntPush( vOrder, (int)(Entry >> 32) );
    Vec_WrdFree( vSortData );
    return vOrder;
}